

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

HermiteSpline<3U,_2U> * fit_and_draw_spline<HermiteSpline<3u,2u>>(void)

{
  size_type sVar1;
  ulong uVar2;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *pDVar3;
  Scalar *pSVar4;
  HermiteSpline<3U,_2U> *in_RDI;
  double dVar5;
  _InputArray local_490;
  allocator<char> local_471;
  string local_470 [32];
  Scalar_<double> local_450;
  Point_<int> local_430;
  _InputOutputArray local_428;
  int local_40c;
  undefined1 local_408 [4];
  int k;
  Mat_<cv::Vec<float,_3>_> local_3f8;
  HermiteSpline<3U,_2U> local_398;
  Matrix<double,_2,_1,_0,_2,_1> local_378;
  Matrix<double,_2,_1,_0,_2,_1> local_368;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_350;
  HermiteSpline<3U,_2U> local_338;
  undefined1 local_318 [8];
  Matrix<double,_2,_1,_0,_2,_1> end;
  Matrix<double,_2,_1,_0,_2,_1> start;
  Solver solver;
  Scalar_<double> local_50;
  _InputArray local_30;
  undefined1 local_11;
  HermiteSpline<3U,_2U> *sp;
  
  local_11 = 0;
  HermiteSpline<3U,_2U>::HermiteSpline(in_RDI);
  cv::Scalar_<double>::Scalar_(&local_50,0.0,0.0,0.0,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_30,(Matx<double,_4,_1> *)&local_50);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&frame,&local_30);
  cv::_InputArray::~_InputArray(&local_30);
  sVar1 = std::
          vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
          ::size(&points);
  if (2 < sVar1) {
    SplineSolver<3U,_2U>::SplineSolver
              ((SplineSolver<3U,_2U> *)
               (start.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
              ((Matrix<double,_2,_1,_0,_2,_1> *)
               (end.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_318);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
               (end.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_318);
    std::
    vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    ::vector(&local_350,&points);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
              (&local_368,
               (Matrix<double,_2,_1,_0,_2,_1> *)
               (end.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
              (&local_378,(Matrix<double,_2,_1,_0,_2,_1> *)local_318);
    BaseSplineSolver<3U,_2U>::solve
              ((BaseSplineSolver<3U,_2U> *)solver.A.m_innerSize,
               (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)solver.A.m_outerSize,(Matrix<double,_2,_1,_0,_2,_1> *)solver.A._0_8_,
               (Matrix<double,_2,_1,_0,_2,_1> *)
               solver.super_BaseSplineSolver<3U,_2U>._vptr_BaseSplineSolver);
    HermiteSpline<3U,_2U>::operator=(in_RDI,&local_338);
    HermiteSpline<3U,_2U>::~HermiteSpline(&local_338);
    std::
    vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    ::~vector(&local_350);
    HermiteSpline<3U,_2U>::HermiteSpline(&local_398,in_RDI);
    cv::Mat_<cv::Vec<float,_3>_>::Mat_(&local_3f8,&frame);
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
              ((Matrix<double,2,1,0,2,1> *)local_408,&scale,&scale);
    draw_spline<3u>(&local_398,&local_3f8,(Vector2d *)local_408);
    cv::Mat_<cv::Vec<float,_3>_>::~Mat_(&local_3f8);
    HermiteSpline<3U,_2U>::~HermiteSpline(&local_398);
    SplineSolver<3U,_2U>::~SplineSolver
              ((SplineSolver<3U,_2U> *)
               (start.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1));
  }
  for (local_40c = 0; uVar2 = (ulong)local_40c,
      sVar1 = std::
              vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              ::size(&points), uVar2 < sVar1; local_40c = local_40c + 1) {
    cv::_InputOutputArray::_InputOutputArray<cv::Vec<float,3>>(&local_428,&frame);
    pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
             std::
             vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             ::operator[](&points,(long)local_40c);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x(pDVar3);
    dVar5 = *pSVar4 * scale;
    pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
             std::
             vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             ::operator[](&points,(long)local_40c);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y(pDVar3);
    cv::Point_<int>::Point_(&local_430,(int)dVar5,(int)(*pSVar4 * scale));
    cv::Scalar_<double>::Scalar_(&local_450,0.0,1.0,0.0,0.0);
    cv::circle(&local_428,&local_430,5,&local_450,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_428);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_470,"w1",&local_471);
  cv::_InputArray::_InputArray<cv::Vec<float,3>>(&local_490,&frame);
  cv::imshow(local_470,&local_490);
  cv::_InputArray::~_InputArray(&local_490);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator(&local_471);
  return in_RDI;
}

Assistant:

Spline fit_and_draw_spline()
{
    Spline sp;

    frame.setTo(Scalar(0.0f,0.0f, 0.0f)); // clear frame

    if (points.size() >= 3)
    {
        typename Spline::Solver solver;

        Matrix<double, 2, Spline::Polynomial1::RequiredValues - 1> start;
        Matrix<double, 2, Spline::Polynomial1::RequiredValues - 1> end;

        start.setZero();
        end.setZero();

        sp = solver.solve(points, start, end);
        draw_spline(sp, frame, Vector2d(scale, scale));
    }

    for (int k = 0; k < points.size(); ++k)
    {
        circle(frame, Point((int)(points[k].x() * scale), (int)(points[k].y() * scale)), 5.0, Scalar(0.0f, 1.0f, 0.0f), FILLED);
    }

    imshow(WINDOW1, frame);

    return sp;
}